

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Mat * rotate(Mat *__return_storage_ptr__,Mat *src,int angle)

{
  undefined8 uVar1;
  __m128 t_1;
  __m128 t;
  Rect2f bbox;
  float fStack_170;
  float fStack_16c;
  Mat local_128;
  undefined1 local_c8 [16];
  uchar *local_b8;
  uchar *puStack_b0;
  undefined4 local_60 [2];
  Mat *local_58;
  undefined8 local_50;
  
  cv::getRotationMatrix2D_(SUB84((double)angle,0),0x3ff0000000000000,local_60);
  local_128.size.p = &local_128.rows;
  local_128.flags = 0x42ff4006;
  local_128.dims = 2;
  local_128.rows = 2;
  local_128.cols = 3;
  local_128.data = (uchar *)0x0;
  local_128.datastart = (uchar *)0x0;
  local_128.dataend = (uchar *)0x0;
  local_128.datalimit = (uchar *)0x0;
  local_128.allocator = (MatAllocator *)0x0;
  local_128.u = (UMatData *)0x0;
  local_128.step.p = local_128.step.buf;
  local_128.step.buf[0] = 0;
  local_128.step.buf[1] = 0;
  cv::Mat::Mat((Mat *)local_c8,2,3,6,local_60,0);
  cv::Mat::copyTo((_OutputArray *)local_c8);
  cv::Mat::~Mat((Mat *)local_c8);
  local_c8._0_4_ = 0;
  local_c8._4_4_ = 0;
  uVar1 = *(undefined8 *)(src->size).p;
  local_c8._12_4_ = (float)(int)uVar1;
  local_c8._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
  local_b8 = (uchar *)CONCAT44(local_b8._4_4_,(float)angle);
  cv::RotatedRect::boundingRect2f();
  *(double *)(local_128.data + 0x10) =
       ((double)fStack_170 * 0.5 - (double)src->cols * 0.5) + *(double *)(local_128.data + 0x10);
  *(double *)(local_128.data + *local_128.step.p + 0x10) =
       ((double)fStack_16c * 0.5 - (double)src->rows * 0.5) +
       *(double *)(local_128.data + *local_128.step.p + 0x10);
  cv::Mat::Mat(__return_storage_ptr__);
  local_50 = 0;
  local_60[0] = 0x1010000;
  local_b8 = (uchar *)0x0;
  puStack_b0 = (uchar *)0x0;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = 0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_58 = src;
  cv::warpAffine();
  cv::Mat::~Mat(&local_128);
  return __return_storage_ptr__;
}

Assistant:

Mat rotate(Mat src,int angle){
    Point2f center((src.cols-1)/2.0, (src.rows-1)/2.0);
    Mat rot = getRotationMatrix2D(center, angle, 1.0);
    Rect2f bbox = RotatedRect(cv::Point2f(), src.size(), angle).boundingRect2f();
    rot.at<double>(0,2) += bbox.width/2.0 - src.cols/2.0;
    rot.at<double>(1,2) += bbox.height/2.0 - src.rows/2.0;
    Mat final_img;
    warpAffine(src, final_img, rot, bbox.size());
    return final_img;
}